

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::api::anon_unknown_1::createSingleTest<vkt::api::(anonymous_namespace)::ComputePipeline>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,undefined8 param_3,
          Parameters *param_4)

{
  Parameters *extraout_RDX;
  Unique<vk::Handle<(vk::HandleType)18>_> obj;
  Resources res;
  Environment env;
  VkPipeline local_138;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_130;
  Move<vk::Handle<(vk::HandleType)18>_> local_118;
  Resources local_f0;
  Environment local_50;
  
  local_50.vkp = *(PlatformInterface **)(this + 8);
  local_50.vkd = Context::getDeviceInterface((Context *)this);
  local_50.device = Context::getDevice((Context *)this);
  local_50.queueFamilyIndex = Context::getUniversalQueueFamilyIndex((Context *)this);
  local_50.programBinaries = *(BinaryCollection **)(this + 0x10);
  local_50.allocationCallbacks = (VkAllocationCallbacks *)0x0;
  local_50.maxResourceConsumers = 1;
  ComputePipeline::Resources::Resources(&local_f0,&local_50,extraout_RDX);
  ComputePipeline::create(&local_118,&local_50,&local_f0,param_4);
  DStack_130.m_device =
       local_118.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
  DStack_130.m_allocator =
       local_118.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  local_138.m_internal._4_4_ =
       local_118.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal._4_4_;
  local_138.m_internal._0_4_ =
       (undefined4)local_118.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal
  ;
  DStack_130.m_deviceIface._0_4_ =
       local_118.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface._0_4_;
  DStack_130.m_deviceIface._4_4_ =
       local_118.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface._4_4_;
  if (local_138.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()(&DStack_130,local_138);
  }
  local_138.m_internal = (deUint64)&DStack_130.m_device;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"Ok","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_138.m_internal,
             (undefined1 *)
             (CONCAT44(DStack_130.m_deviceIface._4_4_,DStack_130.m_deviceIface._0_4_) +
             local_138.m_internal));
  if ((VkDevice *)local_138.m_internal != &DStack_130.m_device) {
    operator_delete((void *)local_138.m_internal,(ulong)(DStack_130.m_device + 1));
  }
  ComputePipeline::Resources::~Resources(&local_f0);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSingleTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 1u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}